

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  __type _Var1;
  int iVar2;
  size_type sVar3;
  reference ppcVar4;
  cmState *pcVar5;
  char *pcVar6;
  undefined4 extraout_var;
  allocator local_111;
  string local_110;
  CacheEntryType local_ec;
  undefined1 local_e8 [4];
  CacheEntryType t;
  string fixedNewValue;
  string fixedOldValue;
  undefined1 local_a0 [8];
  string newValue;
  undefined1 local_78 [8];
  string oldValue;
  char *existingValue;
  string cacheKey;
  size_t i;
  size_t size;
  cmCursesMainForm *this_local;
  
  sVar3 = std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
          ::size(this->Entries);
  for (cacheKey.field_2._8_8_ = 0; (ulong)cacheKey.field_2._8_8_ < sVar3;
      cacheKey.field_2._8_8_ = cacheKey.field_2._8_8_ + 1) {
    ppcVar4 = std::
              vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              ::operator[](this->Entries,cacheKey.field_2._8_8_);
    std::__cxx11::string::string((string *)&existingValue,(string *)&(*ppcVar4)->Key);
    pcVar5 = cmake::GetState(this->CMakeInstance);
    pcVar6 = cmState::GetCacheEntryValue(pcVar5,(string *)&existingValue);
    if (pcVar6 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_78,pcVar6,(allocator *)(newValue.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(newValue.field_2._M_local_buf + 0xf));
      ppcVar4 = std::
                vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                ::operator[](this->Entries,cacheKey.field_2._8_8_);
      iVar2 = (*(*ppcVar4)->Entry->_vptr_cmCursesWidget[5])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar2),
                 (allocator *)(fixedOldValue.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(fixedOldValue.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)(fixedNewValue.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_e8);
      pcVar5 = cmake::GetState(this->CMakeInstance);
      local_ec = cmState::GetCacheEntryType(pcVar5,(string *)&existingValue);
      FixValue(this,local_ec,(string *)local_78,(string *)((long)&fixedNewValue.field_2 + 8));
      FixValue(this,local_ec,(string *)local_a0,(string *)local_e8);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&fixedNewValue.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8);
      if (!_Var1) {
        pcVar5 = cmake::GetState(this->CMakeInstance);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,"MODIFIED",&local_111);
        cmState::SetCacheEntryBoolProperty(pcVar5,(string *)&existingValue,&local_110,true);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        pcVar5 = cmake::GetState(this->CMakeInstance);
        cmState::SetCacheEntryValue(pcVar5,(string *)&existingValue,(string *)local_e8);
      }
      std::__cxx11::string::~string((string *)local_e8);
      std::__cxx11::string::~string((string *)(fixedNewValue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::__cxx11::string::~string((string *)&existingValue);
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  size_t size = this->Entries->size();
  for(size_t i=0; i < size; i++)
    {
    std::string cacheKey = (*this->Entries)[i]->Key;
      const char* existingValue = this->CMakeInstance->GetState()
        ->GetCacheEntryValue(cacheKey);
    if (existingValue)
      {
      std::string oldValue = existingValue;
      std::string newValue = (*this->Entries)[i]->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmState::CacheEntryType t =
          this->CMakeInstance->GetState()
              ->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if(!(fixedOldValue == fixedNewValue))
        {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()
            ->SetCacheEntryBoolProperty(cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()
            ->SetCacheEntryValue(cacheKey, fixedNewValue);
        }
      }
    }
}